

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

error_code __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
set_option_linger(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this
                 ,bool b,uint16_t timeout,error_code *ec)

{
  undefined6 in_register_00000012;
  undefined7 in_register_00000031;
  error_code eVar1;
  error_code eVar2;
  linger_type local_8;
  error_category *peVar3;
  
  local_8.l_linger = (int)CONCAT62(in_register_00000012,timeout);
  local_8.l_onoff = (int)CONCAT71(in_register_00000031,b);
  eVar1 = asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
          set_option<asio::detail::socket_option::linger<1,13>>
                    ((basic_socket<asio::ip::tcp,asio::any_io_executor> *)&this->socket_,
                     (linger<1,_13> *)&local_8,ec);
  eVar2._M_value = eVar1._M_value;
  eVar2._4_4_ = eVar1._4_4_;
  register0x00000010 = eVar1._M_cat;
  return eVar2;
}

Assistant:

std::error_code
        set_option_linger(bool b, uint16_t timeout, std::error_code& ec)
    {
        return set_option(asio::socket_base::linger(b, timeout), ec);
    }